

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFEFStreamObjectHelper::setParam
          (QPDFEFStreamObjectHelper *this,string *pkey,QPDFObjectHandle *pval)

{
  bool bVar1;
  QPDFObjectHandle local_f0;
  allocator<char> local_d9;
  QPDFObjectHandle local_d8 [2];
  undefined1 local_b8 [32];
  QPDFObjectHandle local_98;
  allocator<char> local_81;
  string local_80 [48];
  undefined1 local_50 [32];
  undefined1 local_30 [8];
  QPDFObjectHandle params;
  QPDFObjectHandle *pval_local;
  string *pkey_local;
  QPDFEFStreamObjectHelper *this_local;
  
  params.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pval;
  QPDFObjectHelper::oh((QPDFObjectHelper *)local_50);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_50 + 0x10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"/Params",&local_81);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_30,(string *)(local_50 + 0x10));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_50 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_50);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_30);
  if (!bVar1) {
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_b8);
    QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_b8 + 0x10));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"/Params",&local_d9);
    QPDFObjectHandle::newDictionary();
    QPDFObjectHandle::replaceKeyAndGetNew(&local_98,(string *)(local_b8 + 0x10),local_d8);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_30,&local_98);
    QPDFObjectHandle::~QPDFObjectHandle(&local_98);
    QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
    std::__cxx11::string::~string((string *)local_d8);
    std::allocator<char>::~allocator(&local_d9);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_b8 + 0x10));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b8);
  }
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)local_30,pkey,
             (QPDFObjectHandle *)
             params.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  return;
}

Assistant:

void
QPDFEFStreamObjectHelper::setParam(std::string const& pkey, QPDFObjectHandle const& pval)
{
    auto params = oh().getDict().getKey("/Params");
    if (!params.isDictionary()) {
        params = oh().getDict().replaceKeyAndGetNew("/Params", QPDFObjectHandle::newDictionary());
    }
    params.replaceKey(pkey, pval);
}